

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

CappedArray<char,_8UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,unsigned_short i)

{
  char *pcVar1;
  char *pcVar2;
  uint8_t *puVar3;
  char acVar5 [8];
  uint8_t *puVar6;
  undefined6 in_register_00000032;
  char acVar7 [8];
  bool bVar8;
  CappedArray<char,_8UL> CVar9;
  uint8_t reverse [7];
  CappedArray<char,_8UL> result;
  uint uVar4;
  
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  if ((int)CONCAT62(in_register_00000032,i) == 0) {
    puVar3 = reverse + 1;
  }
  else {
    acVar5[2] = '\0';
    acVar5[3] = '\0';
    acVar5[4] = '\0';
    acVar5[5] = '\0';
    acVar5[6] = '\0';
    acVar5[7] = '\0';
    acVar5._0_2_ = i;
    puVar3 = reverse;
    do {
      uVar4 = acVar5._0_4_;
      acVar7 = (char  [8])((ulong)acVar5 / 10);
      *puVar3 = acVar5[0] + (char)((ulong)acVar5 / 10) * -10;
      puVar3 = puVar3 + 1;
      acVar5 = acVar7;
    } while (9 < uVar4);
    pcVar2 = result.content;
    if (puVar3 <= reverse) goto LAB_001a7d29;
  }
  puVar6 = puVar3 + 0xf;
  pcVar1 = result.content;
  do {
    puVar3 = puVar3 + -1;
    *pcVar1 = *puVar3 + '0';
    pcVar2 = pcVar1 + 1;
    bVar8 = (uint8_t *)pcVar1 != puVar6;
    pcVar1 = pcVar2;
    acVar7 = result.content;
  } while (bVar8);
LAB_001a7d29:
  CVar9.currentSize = (long)pcVar2 - (long)result.content;
  CVar9.content[0] = acVar7[0];
  CVar9.content[1] = acVar7[1];
  CVar9.content[2] = acVar7[2];
  CVar9.content[3] = acVar7[3];
  CVar9.content[4] = acVar7[4];
  CVar9.content[5] = acVar7[5];
  CVar9.content[6] = acVar7[6];
  CVar9.content[7] = acVar7[7];
  return CVar9;
}

Assistant:

CappedArray(): currentSize(fixedSize) {}